

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O3

void yajl_string_decode(yajl_buf buf,uchar *str,size_t len)

{
  byte bVar1;
  undefined4 uVar2;
  undefined1 uVar3;
  uint uVar4;
  ulong in_RAX;
  undefined1 *puVar5;
  size_t sVar6;
  uint uVar7;
  char *__s;
  long lVar8;
  uint uVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  char utf8Buf [5];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (len == 0) {
    uVar12 = 0;
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    uVar12 = 0;
    do {
      if (str[uVar13] == '\\') {
        yajl_buf_append(buf,str + uVar12,uVar13 - uVar12);
        lVar8 = uVar13 + 1;
        bVar1 = str[uVar13 + 1];
        if (bVar1 < 0x62) {
          if (bVar1 == 0x22) {
            __s = "\"";
          }
          else if (bVar1 == 0x2f) {
            __s = "/";
          }
          else {
            if (bVar1 != 0x5c) goto switchD_001049ff_caseD_6f;
            __s = "\\";
          }
        }
        else {
          switch(bVar1) {
          case 0x6e:
            __s = "\n";
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
switchD_001049ff_caseD_6f:
            __s = "?";
            break;
          case 0x72:
            __s = "\r";
            break;
          case 0x74:
            __s = "\t";
            break;
          case 0x75:
            lVar8 = 0;
            uVar4 = 0;
            do {
              uVar9 = uVar4;
              bVar1 = str[lVar8 + uVar13 + 2];
              bVar10 = (bVar1 & 0xdf) - 7;
              if (bVar1 < 0x41) {
                bVar10 = bVar1;
              }
              uVar7 = uVar9 << 4;
              uVar4 = (byte)(bVar10 - 0x30) | uVar7;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
            uVar2 = uStack_38._4_4_;
            if ((uVar9 & 0xfc0) == 0xd80) {
              lVar8 = uVar13 + 6;
              if (str[uVar13 + 6] != '\\') goto switchD_001049ff_caseD_6f;
              __s = "?";
              if (str[uVar13 + 7] == 'u') {
                lVar8 = 0;
                uVar4 = 0;
                do {
                  bVar1 = str[lVar8 + uVar13 + 8];
                  bVar11 = (bVar1 & 0xdf) - 7;
                  if (bVar1 < 0x41) {
                    bVar11 = bVar1;
                  }
                  uVar9 = uVar4 << 4;
                  uVar4 = (byte)(bVar11 - 0x30) | uVar9;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                uVar4 = ((uint)(byte)(bVar10 - 0x30) | uVar7 & 0x3ff) * 0x400 +
                        ((uint)(byte)(bVar11 - 0x30) | uVar9 & 0x3ff) + 0x10000;
                lVar8 = uVar13 + 0xb;
LAB_00104b0e:
                uVar13 = CONCAT35(uStack_38._5_3_,
                                  CONCAT14((char)(uVar4 >> 0xc),
                                           CONCAT13((char)(uVar4 >> 0x12),(undefined3)uStack_38))) &
                         0xffffff3fffffffff;
                uStack_38._6_2_ = (undefined2)(uVar13 >> 0x30);
                uVar13 = CONCAT26(uStack_38._6_2_,CONCAT15((char)(uVar4 >> 6),(int5)uVar13)) &
                         0xffff3fffffffffff;
                uStack_38._7_1_ = (undefined1)(uVar13 >> 0x38);
                uStack_38 = CONCAT17(uStack_38._7_1_,CONCAT16((char)uVar4,(int6)uVar13)) &
                            0xff3fffffffffffff | 0x808080f0000000;
                puVar5 = (undefined1 *)((long)&uStack_38 + 7);
                goto LAB_00104c22;
              }
            }
            else {
              lVar8 = uVar13 + 5;
              uVar3 = (undefined1)uVar4;
              if (uVar4 < 0x80) {
                uStack_38._0_4_ = CONCAT13(uVar3,(undefined3)uStack_38);
                uStack_38._0_5_ = (uint5)(uint)uStack_38;
                __s = (char *)((long)&uStack_38 + 3);
                if (uVar4 == 0) {
                  yajl_buf_append(buf,(void *)((long)&uStack_38 + 3),1);
                  uVar12 = uVar13 + 6;
                  uVar13 = uVar12;
                  goto LAB_00104c45;
                }
              }
              else {
                if (uVar7 < 0x800) {
                  uStack_38 = CONCAT35(uStack_38._5_3_,
                                       CONCAT14(uVar3,CONCAT13((char)(uVar4 >> 6),
                                                               (undefined3)uStack_38))) &
                              0xffffff3fffffffff | 0x80c0000000;
                  puVar5 = (undefined1 *)((long)&uStack_38 + 5);
                }
                else if (uVar7 < 0x10000) {
                  uVar13 = CONCAT35(uStack_38._5_3_,
                                    CONCAT14((char)(uVar4 >> 6),
                                             CONCAT13((char)(uVar7 >> 0xc),(undefined3)uStack_38)))
                           & 0xffffff3fffffffff;
                  uStack_38._6_2_ = (undefined2)(uVar13 >> 0x30);
                  uStack_38 = CONCAT26(uStack_38._6_2_,CONCAT15(uVar3,(int5)uVar13)) &
                              0xffff3fffffffffff | 0x8080e0000000;
                  puVar5 = (undefined1 *)((long)&uStack_38 + 6);
                }
                else {
                  if (uVar7 < 0x200000) goto LAB_00104b0e;
                  uStack_38._0_4_ = CONCAT13(0x3f,(undefined3)uStack_38);
                  uStack_38 = CONCAT44(uVar2,(uint)uStack_38);
                  puVar5 = (undefined1 *)((long)&uStack_38 + 4);
                }
LAB_00104c22:
                *puVar5 = 0;
                __s = (char *)((long)&uStack_38 + 3);
              }
            }
            break;
          default:
            if (bVar1 == 0x62) {
              __s = "\b";
            }
            else {
              if (bVar1 != 0x66) goto switchD_001049ff_caseD_6f;
              __s = "\f";
            }
          }
        }
        sVar6 = strlen(__s);
        yajl_buf_append(buf,__s,sVar6 & 0xffffffff);
        uVar12 = lVar8 + 1;
        uVar13 = uVar12;
      }
      else {
        uVar13 = uVar13 + 1;
      }
LAB_00104c45:
    } while (uVar13 < len);
  }
  yajl_buf_append(buf,str + uVar12,uVar13 - uVar12);
  return;
}

Assistant:

void yajl_string_decode(yajl_buf buf, const unsigned char * str,
                        size_t len)
{
    size_t beg = 0;
    size_t end = 0;    

    while (end < len) {
        if (str[end] == '\\') {
            char utf8Buf[5];
            const char * unescaped = "?";
            yajl_buf_append(buf, str + beg, end - beg);
            switch (str[++end]) {
                case 'r': unescaped = "\r"; break;
                case 'n': unescaped = "\n"; break;
                case '\\': unescaped = "\\"; break;
                case '/': unescaped = "/"; break;
                case '"': unescaped = "\""; break;
                case 'f': unescaped = "\f"; break;
                case 'b': unescaped = "\b"; break;
                case 't': unescaped = "\t"; break;
                case 'u': {
                    unsigned int codepoint = 0;
                    hexToDigit(&codepoint, str + ++end);
                    end+=3;
                    /* check if this is a surrogate */
                    if ((codepoint & 0xFC00) == 0xD800) {
                        end++;
                        if (str[end] == '\\' && str[end + 1] == 'u') {
                            unsigned int surrogate = 0;
                            hexToDigit(&surrogate, str + end + 2);
                            codepoint =
                                (((codepoint & 0x3F) << 10) | 
                                 ((((codepoint >> 6) & 0xF) + 1) << 16) | 
                                 (surrogate & 0x3FF));
                            end += 5;
                        } else {
                            unescaped = "?";
                            break;
                        }
                    }
                    
                    Utf32toUtf8(codepoint, utf8Buf);
                    unescaped = utf8Buf;

                    if (codepoint == 0) {
                        yajl_buf_append(buf, unescaped, 1);
                        beg = ++end;
                        continue;
                    }

                    break;
                }
                default:
                    assert("this should never happen" == NULL);
            }
            yajl_buf_append(buf, unescaped, (unsigned int)strlen(unescaped));
            beg = ++end;
        } else {
            end++;
        }
    }
    yajl_buf_append(buf, str + beg, end - beg);
}